

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O3

void __thiscall
nnad::FeedForwardNN<double>::SetParameters
          (FeedForwardNN<double> *this,vector<double,_std::allocator<double>_> *Pars)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  int iVar5;
  mapped_type *pmVar6;
  mapped_type *this_00;
  ostream *poVar7;
  ulong uVar8;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *this_01;
  coordinates coord;
  key_type local_5c;
  _Tuple_impl<2UL,_int,_int> local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  uVar1 = this->_NpPrep;
  iVar5 = this->_Np;
  if (uVar1 + iVar5 ==
      (int)((ulong)((long)(Pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(Pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    local_5c = 0;
    if (0 < iVar5) {
      do {
        pmVar6 = std::
                 map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
                 ::at(&this->_IntMap,&local_5c);
        local_58 = (pmVar6->super__Tuple_impl<0UL,_bool,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>;
        lVar4 = *(long *)&(pmVar6->super__Tuple_impl<0UL,_bool,_int,_int,_int>).
                          super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>;
        uStack_50._4_1_ = (char)((ulong)lVar4 >> 0x20);
        this_01 = &this->_Biases;
        if (uStack_50._4_1_ != '\0') {
          this_01 = &this->_Links;
        }
        uStack_50 = lVar4;
        this_00 = std::
                  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                  ::at(this_01,(key_type *)&uStack_50);
        Matrix<double>::SetElement
                  (this_00,&local_58.super__Head_base<2UL,_int,_false>._M_head_impl,(int *)&local_58
                   ,(Pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start + local_5c);
        local_5c = local_5c + 1;
        iVar5 = this->_Np;
      } while (local_5c < iVar5);
      uVar1 = this->_NpPrep;
    }
    if (0 < (int)uVar1) {
      pdVar2 = (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (Pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        pdVar2[uVar8] = pdVar3[(long)iVar5 + uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    return;
  }
  local_58 = (_Tuple_impl<2UL,_int,_int>)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "SetParameters: the number of parameters does not match that of the NN plus that of the preprocessing function."
             ,"");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_58,uStack_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
  std::endl<char,std::char_traits<char>>(poVar7);
  exit(-10);
}

Assistant:

void SetParameters(std::vector<T> const& Pars)
    {
      // Check that the size of the parameter vector is equal to the
      // number of parameters of the current NN plus the number of
      // parameters of the preprocessing function.
      if ((int) Pars.size() != _Np + _NpPrep)
        Error("SetParameters: the number of parameters does not match that of the NN plus that of the preprocessing function.");

      // Set links and biases
      for (int ip = 0; ip < _Np; ip++)
        {
          const coordinates coord = _IntMap.at(ip);
          if (std::get<0>(coord))
            _Links.at(std::get<1>(coord)).SetElement(std::get<2>(coord), std::get<3>(coord), Pars[ip]);
          else
            _Biases.at(std::get<1>(coord)).SetElement(std::get<2>(coord), std::get<3>(coord), Pars[ip]);
        }

      // Set preprocessing parameters
      for (int ip = 0; ip < _NpPrep; ip++)
        _PreprocPars[ip] = Pars[_Np + ip];
    }